

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

void __thiscall Am_Object_Data::note_parts(Am_Object_Data *this)

{
  Am_Object_Data *this_00;
  Am_Object_Data **ppAVar1;
  Am_Object_Context oc;
  Am_Object_Context local_21;
  Am_Slot local_20;
  
  local_21.is_inherited = false;
  local_20.data = &this->owner_slot;
  am_CList::Slot_Event(&(this->owner_slot).dependencies,&local_21,&local_20);
  ppAVar1 = &this->first_part;
  while (this_00 = *ppAVar1, this_00 != (Am_Object_Data *)0x0) {
    note_parts(this_00);
    local_20.data = &this_00->part_slot;
    am_CList::Slot_Event(&(this_00->part_slot).dependencies,&local_21,&local_20);
    ppAVar1 = &this_00->next_part;
  }
  return;
}

Assistant:

void
Am_Object_Data::note_parts()
{
  Am_Object_Context oc(false);
  owner_slot.dependencies.Slot_Event(&oc, &owner_slot);
  Am_Object_Data *curr_part;
  for (curr_part = first_part; curr_part != nullptr;
       curr_part = curr_part->next_part) {
    curr_part->note_parts();
    curr_part->part_slot.dependencies.Slot_Event(&oc, &curr_part->part_slot);
  }
}